

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool anon_unknown.dwarf_5db41::arg_value_error(string *name,string *s,char *type)

{
  undefined1 uVar1;
  Logger *pLVar2;
  ostream *poVar3;
  allocator local_41;
  string local_40;
  
  pLVar2 = GEO::Logger::instance();
  pLVar2->quiet_ = false;
  std::__cxx11::string::string((string *)&local_40,"CmdLine",&local_41);
  poVar3 = GEO::Logger::err(&local_40);
  poVar3 = std::operator<<(poVar3,"Argument ");
  poVar3 = std::operator<<(poVar3,(string *)name);
  poVar3 = std::operator<<(poVar3," received a bad value: \'");
  poVar3 = std::operator<<(poVar3,(string *)s);
  poVar3 = std::operator<<(poVar3,"\' is not a ");
  poVar3 = std::operator<<(poVar3,type);
  poVar3 = std::operator<<(poVar3," value");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar1 = std::__cxx11::string::~string((string *)&local_40);
  return (bool)uVar1;
}

Assistant:

bool arg_value_error(
        const std::string& name,
        const std::string& s, const char* type
    ) {
        Logger::instance()->set_quiet(false);
        Logger::err("CmdLine")
            << "Argument " << name << " received a bad value: '"
            << s << "' is not a " << type << " value"
            << std::endl;
        return false;
    }